

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O0

AnimInterpolator * rw::AnimInterpolator::create(int32 numNodes,int32 maxFrameSize)

{
  FILE *__stream;
  char *pcVar1;
  Error local_30;
  Error _e;
  int32 realsz;
  int32 sz;
  AnimInterpolator *interp;
  int32 maxFrameSize_local;
  int32 numNodes_local;
  
  _e.plugin = maxFrameSize + 0x10;
  _e.code = numNodes * _e.plugin + 0x48;
  _maxFrameSize_local =
       (AnimInterpolator *)
       malloc_LOC((long)(int)_e.code,0x3001b,
                  "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/anim.cpp line: 197"
                 );
  if (_maxFrameSize_local == (AnimInterpolator *)0x0) {
    local_30.plugin = 0x1b;
    local_30.code = 0x80000002;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/anim.cpp",199);
    __stream = _stderr;
    pcVar1 = dbgsprint(0x80000002,(ulong)_e.code);
    fprintf(__stream,"%s\n",pcVar1);
    setError(&local_30);
    _maxFrameSize_local = (AnimInterpolator *)0x0;
  }
  else {
    _maxFrameSize_local->currentAnim = (Animation *)0x0;
    _maxFrameSize_local->currentTime = 0.0;
    _maxFrameSize_local->nextFrame = (void *)0x0;
    _maxFrameSize_local->maxInterpKeyFrameSize = maxFrameSize;
    _maxFrameSize_local->currentInterpKeyFrameSize = maxFrameSize;
    _maxFrameSize_local->currentAnimKeyFrameSize = -1;
    _maxFrameSize_local->numNodes = numNodes;
  }
  return _maxFrameSize_local;
}

Assistant:

AnimInterpolator*
AnimInterpolator::create(int32 numNodes, int32 maxFrameSize)
{
	AnimInterpolator *interp;
	int32 sz;
	int32 realsz = maxFrameSize;

	// Add some space for pointers and padding, hopefully this will be
	// enough. Don't change maxFrameSize not to mess up streaming.
	if(sizeof(void*) > 4)
		realsz += 16;
	sz = sizeof(AnimInterpolator) + numNodes*realsz;
	interp = (AnimInterpolator*)rwMalloc(sz, MEMDUR_EVENT | ID_ANIMANIMATION);
	if(interp == nil){
		RWERROR((ERR_ALLOC, sz));
		return nil;
	}
	interp->currentAnim = nil;
	interp->currentTime = 0.0f;
	interp->nextFrame = nil;
	interp->maxInterpKeyFrameSize = maxFrameSize;
	interp->currentInterpKeyFrameSize = maxFrameSize;
	interp->currentAnimKeyFrameSize = -1;
	interp->numNodes = numNodes;;

	return interp;
}